

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  TSPStateImp *this;
  TSPSA *this_00;
  
  this = (TSPStateImp *)operator_new(0x28);
  TSPStateImp::TSPStateImp(this);
  (*(this->super_StateImp<std::vector<int,_std::allocator<int>_>_>)._vptr_StateImp[6])(this);
  this_00 = (TSPSA *)operator_new(0x38);
  TSPSA::TSPSA(this_00,(StateImp<std::vector<int,_std::allocator<int>_>_> *)this);
  SA<std::vector<int,_std::allocator<int>_>_>::SimulatedAnnealing
            ((SA<std::vector<int,_std::allocator<int>_>_> *)this_00);
  (*(this->super_StateImp<std::vector<int,_std::allocator<int>_>_>)._vptr_StateImp[1])(this);
  operator_delete(this_00);
  return 0;
}

Assistant:

int main()
{
	StateImp<std::vector<int>> *tspImp = new TSPStateImp();

	tspImp->InitData();

	SA<std::vector<int>> *tspSA = new TSPSA(tspImp);

	tspSA->SimulatedAnnealing();

	delete tspImp;

	delete tspSA;

	return 0;
}